

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O0

void co_eventloop(stCoEpoll_t *ctx,pfn_co_eventloop_t pfn,void *arg)

{
  stTimeoutItemLink_t *apLink;
  stTimeoutItemLink_t *apResult;
  stTimeoutItem_t *ap;
  int iVar1;
  co_epoll_res *pcVar2;
  unsigned_long_long allNow;
  stTimeoutItem_t *psStack_60;
  int ret_1;
  stTimeoutItem_t *lp;
  unsigned_long_long now;
  stTimeoutItem_t *item;
  int i;
  stTimeoutItemLink_t *timeout;
  stTimeoutItemLink_t *active;
  int ret;
  co_epoll_res *result;
  void *arg_local;
  pfn_co_eventloop_t pfn_local;
  stCoEpoll_t *ctx_local;
  
  if (ctx->result == (co_epoll_res *)0x0) {
    pcVar2 = co_epoll_res_alloc(0x2800);
    ctx->result = pcVar2;
  }
  pcVar2 = ctx->result;
  do {
    iVar1 = co_epoll_wait(ctx->iEpollFd,pcVar2,0x2800,1);
    apLink = ctx->pstActiveList;
    apResult = ctx->pstTimeoutList;
    memset(apResult,0,0x10);
    for (item._4_4_ = 0; item._4_4_ < iVar1; item._4_4_ = item._4_4_ + 1) {
      ap = (stTimeoutItem_t *)pcVar2->events[item._4_4_].data.ptr;
      if (ap->pfnPrepare == (OnPreparePfn_t)0x0) {
        AddTail<stTimeoutItem_t,stTimeoutItemLink_t>(apLink,ap);
      }
      else {
        (*ap->pfnPrepare)(ap,pcVar2->events + item._4_4_,apLink);
      }
    }
    allNow = GetTickMS();
    TakeAllTimeout(ctx->pTimeout,allNow,apResult);
    for (psStack_60 = apResult->head; psStack_60 != (stTimeoutItem_t *)0x0;
        psStack_60 = psStack_60->pNext) {
      psStack_60->bTimeout = true;
    }
    Join<stTimeoutItem_t,stTimeoutItemLink_t>(apLink,apResult);
    psStack_60 = apLink->head;
    while (psStack_60 != (stTimeoutItem_t *)0x0) {
      PopHead<stTimeoutItem_t,stTimeoutItemLink_t>(apLink);
      if ((((psStack_60->bTimeout & 1U) == 0) || (psStack_60->ullExpireTime <= allNow)) ||
         (iVar1 = AddTimeout(ctx->pTimeout,psStack_60,allNow), iVar1 != 0)) {
        if (psStack_60->pfnProcess != (OnProcessPfn_t)0x0) {
          (*psStack_60->pfnProcess)(psStack_60);
        }
        psStack_60 = apLink->head;
      }
      else {
        psStack_60->bTimeout = false;
        psStack_60 = apLink->head;
      }
    }
  } while ((pfn == (pfn_co_eventloop_t)0x0) || (iVar1 = (*pfn)(arg), iVar1 != -1));
  return;
}

Assistant:

void co_eventloop( stCoEpoll_t *ctx,pfn_co_eventloop_t pfn,void *arg )
{
	if( !ctx->result )
	{
		ctx->result =  co_epoll_res_alloc( stCoEpoll_t::_EPOLL_SIZE );
	}
	co_epoll_res *result = ctx->result;


	for(;;)
	{
		int ret = co_epoll_wait( ctx->iEpollFd,result,stCoEpoll_t::_EPOLL_SIZE, 1 );

		stTimeoutItemLink_t *active = (ctx->pstActiveList);
		stTimeoutItemLink_t *timeout = (ctx->pstTimeoutList);

		memset( timeout,0,sizeof(stTimeoutItemLink_t) );

		for(int i=0;i<ret;i++)
		{
			stTimeoutItem_t *item = (stTimeoutItem_t*)result->events[i].data.ptr;
			if( item->pfnPrepare )
			{
				item->pfnPrepare( item,result->events[i],active );
			}
			else
			{
				AddTail( active,item );
			}
		}


		unsigned long long now = GetTickMS();
		TakeAllTimeout( ctx->pTimeout,now,timeout );

		stTimeoutItem_t *lp = timeout->head;
		while( lp )
		{
			//printf("raise timeout %p\n",lp);
			lp->bTimeout = true;
			lp = lp->pNext;
		}

		Join<stTimeoutItem_t,stTimeoutItemLink_t>( active,timeout );

		lp = active->head;
		while( lp )
		{

			PopHead<stTimeoutItem_t,stTimeoutItemLink_t>( active );
            if (lp->bTimeout && now < lp->ullExpireTime) 
			{
				int ret = AddTimeout(ctx->pTimeout, lp, now);
				if (!ret) 
				{
					lp->bTimeout = false;
					lp = active->head;
					continue;
				}
			}
			if( lp->pfnProcess )
			{
				lp->pfnProcess( lp );
			}

			lp = active->head;
		}
		if( pfn )
		{
			if( -1 == pfn( arg ) )
			{
				break;
			}
		}

	}
}